

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

json_t * json_load_callback(json_load_callback_t callback,void *arg,size_t flags,json_error_t *error
                           )

{
  int iVar1;
  json_t *pjVar2;
  lex_t lex;
  lex_t local_4c0;
  undefined1 local_448 [1040];
  json_load_callback_t local_38;
  void *local_30;
  
  memset(local_448,0,0x410);
  local_38 = callback;
  local_30 = arg;
  jsonp_error_init(error,"<callback>");
  if (callback == (json_load_callback_t)0x0) {
    pjVar2 = (json_t *)0x0;
    error_set(error,(lex_t *)0x0,"wrong arguments");
  }
  else {
    local_4c0.stream.get = callback_get;
    local_4c0.stream.buffer[0] = '\0';
    pjVar2 = (json_t *)0x0;
    local_4c0.stream.buffer_pos = 0;
    local_4c0.stream.state = 0;
    local_4c0.stream.line = 1;
    local_4c0.stream.column = 0;
    local_4c0.stream.position = 0;
    local_4c0.stream.data = local_448;
    iVar1 = strbuffer_init(&local_4c0.saved_text);
    if (iVar1 == 0) {
      local_4c0.token = -1;
      local_4c0.flags = flags;
      pjVar2 = parse_json(&local_4c0,flags,error);
      lex_close(&local_4c0);
    }
  }
  return pjVar2;
}

Assistant:

json_t *json_load_callback(json_load_callback_t callback, void *arg, size_t flags, json_error_t *error)
{
	lex_t lex;
	json_t *result;

	callback_data_t stream_data;

	memset(&stream_data, 0, sizeof(stream_data));
	stream_data.callback = callback;
	stream_data.arg = arg;

	jsonp_error_init(error, "<callback>");

	if (callback == NULL) {
		error_set(error, NULL, "wrong arguments");
		return NULL;
	}

	if (lex_init(&lex, (get_func)callback_get, flags, &stream_data))
		return NULL;

	result = parse_json(&lex, flags, error);

	lex_close(&lex);
	return result;
}